

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O2

UBool service_cleanup(void)

{
  Hashtable *this;
  void *in_RSI;
  
  this = LocaleUtility_cache;
  if (LocaleUtility_cache != (Hashtable *)0x0) {
    icu_63::Hashtable::~Hashtable(LocaleUtility_cache);
    icu_63::UMemory::operator_delete((UMemory *)this,in_RSI);
    LocaleUtility_cache = (Hashtable *)0x0;
  }
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV service_cleanup(void) {
    if (LocaleUtility_cache) {
        delete LocaleUtility_cache;
        LocaleUtility_cache = NULL;
    }
    return TRUE;
}